

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotErrorBarsH<unsigned_long_long>
               (char *label_id,unsigned_long_long *xs,unsigned_long_long *ys,unsigned_long_long *neg
               ,unsigned_long_long *pos,int count,int offset,int stride)

{
  undefined1 local_68 [8];
  GetterError<unsigned_long_long> getter;
  int count_local;
  unsigned_long_long *pos_local;
  unsigned_long_long *neg_local;
  unsigned_long_long *ys_local;
  unsigned_long_long *xs_local;
  char *label_id_local;
  
  getter._44_4_ = count;
  GetterError<unsigned_long_long>::GetterError
            ((GetterError<unsigned_long_long> *)local_68,xs,ys,neg,pos,count,offset,stride);
  PlotErrorBarsHEx<ImPlot::GetterError<unsigned_long_long>>
            (label_id,(GetterError<unsigned_long_long> *)local_68);
  return;
}

Assistant:

void PlotErrorBarsH(const char* label_id, const T* xs, const T* ys, const T* neg, const T* pos, int count, int offset, int stride) {
    GetterError<T> getter(xs, ys, neg, pos, count, offset, stride);
    PlotErrorBarsHEx(label_id, getter);
}